

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_array.c
# Opt level: O1

void assert_not_array(char *json)

{
  cJSON_bool cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  parse_buffer buffer;
  parse_buffer local_48;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.length = 0;
  local_48.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  local_48.hooks.deallocate = (_func_void_void_ptr *)0x0;
  local_48.offset = 0;
  local_48.depth = 0;
  local_48.hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)0x0;
  local_48.content = (uchar *)json;
  sVar2 = strlen(json);
  local_48.length = sVar2 + 1;
  local_48.hooks.allocate = global_hooks.allocate;
  local_48.hooks.deallocate = global_hooks.deallocate;
  local_48.hooks.reallocate = global_hooks.reallocate;
  cVar1 = parse_array(item,&local_48);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x34);
  }
  UnityAssertBits(0xff,0,(long)item[0].type,"Item doesn\'t have expected type.",0x35);
  if (item[0].next != (cJSON *)0x0) {
    UnityFail("Linked list next pointer is not NULL.",0x35);
  }
  if (item[0].prev != (cJSON *)0x0) {
    UnityFail("Linked list previous pointer is not NULL.",0x35);
  }
  if (item[0].child != (cJSON *)0x0) {
    UnityFail("Item has a child.",0x35);
  }
  if (item[0].string != (char *)0x0) {
    UnityFail("String is not NULL.",0x35);
  }
  if (item[0].valuestring != (char *)0x0) {
    UnityFail("Valuestring is not NULL.",0x35);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void assert_not_array(const char *json)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.content = (const unsigned char*)json;
    buffer.length = strlen(json) + sizeof("");
    buffer.hooks = global_hooks;

    TEST_ASSERT_FALSE(parse_array(item, &buffer));
    assert_is_invalid(item);
}